

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPreviewImage.cpp
# Opt level: O1

void testPreviewImage(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  pointer pcVar3;
  bool bVar4;
  long *plVar5;
  long *__s;
  char cVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  void *pvVar10;
  size_t sVar11;
  Header *pHVar12;
  long lVar13;
  int *piVar14;
  void *pvVar15;
  int x;
  int iVar16;
  long lVar17;
  ulong uVar18;
  int y;
  int iVar19;
  long lVar20;
  uint uVar21;
  PreviewImage preview1;
  string filename2;
  string filename1;
  RgbaInputFile file1;
  Header header;
  RgbaOutputFile file2;
  int local_4e8 [2];
  long local_4e0;
  long *local_4d8 [2];
  long local_4c8 [2];
  ulong local_4b8;
  long *local_4b0 [2];
  long local_4a0 [2];
  long *local_490;
  long local_488;
  Rgba local_480 [8];
  Rgba local_440 [2];
  char local_430 [16];
  uint auStack_420 [122];
  Rgba local_238 [2];
  char local_228 [16];
  byte abStack_218 [488];
  
  local_4b0[0] = local_4a0;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4b0,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_4b0);
  local_4d8[0] = local_4c8;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d8,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_4d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing preview image attribute",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  __s = local_4b0[0];
  plVar5 = local_4d8[0];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_piz.exr"
             ,0x77);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile
            ((RgbaInputFile *)local_480,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_piz.exr"
             ,iVar7);
  Imf_3_4::RgbaInputFile::header();
  cVar6 = Imf_3_4::Header::hasPreviewImage();
  if (cVar6 != '\0') {
    __assert_fail("!file1.header ().hasPreviewImage ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                  ,0x39,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  piVar9 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar7 = *piVar9;
  lVar20 = ((long)piVar9[2] - (long)iVar7) + 1;
  iVar19 = piVar9[1];
  iVar8 = ((piVar9[3] - iVar19) + 1) * (int)lVar20;
  uVar18 = 0xffffffffffffffff;
  if (-1 < iVar8) {
    uVar18 = (long)iVar8 * 8;
  }
  pvVar10 = operator_new__(uVar18);
  local_4b8 = (long)pvVar10 + (long)(iVar19 * (int)lVar20) * -8 + (long)iVar7 * -8;
  Imf_3_4::RgbaInputFile::setFrameBuffer(local_480,local_4b8,1);
  Imf_3_4::RgbaInputFile::readPixels((int)local_480,piVar9[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"generating preview image",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar19 = 0;
  Imf_3_4::PreviewImage::PreviewImage((PreviewImage *)local_4e8,0x80,0x40,(PreviewRgba *)0x0);
  iVar7 = -0x80000000;
  do {
    iVar16 = 0;
    iVar8 = iVar7;
    do {
      *(int *)(local_4e0 + (ulong)(uint)(local_4e8[0] * iVar19 + iVar16) * 4) = iVar8;
      iVar16 = iVar16 + 1;
      iVar8 = iVar8 + 0x10002;
    } while (iVar16 != 0x80);
    iVar19 = iVar19 + 1;
    iVar7 = iVar7 + 0x10400;
  } while (iVar19 != 0x40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ecfa0);
  }
  else {
    sVar11 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pHVar12 = (Header *)Imf_3_4::RgbaInputFile::header();
  Imf_3_4::Header::Header((Header *)local_440,pHVar12);
  Imf_3_4::Header::setPreviewImage((PreviewImage *)local_440);
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_238,(char *)__s,(Header *)local_440,WRITE_RGBA,iVar7);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_238,local_4b8,1);
  if (piVar9[1] <= piVar9[3]) {
    iVar7 = piVar9[1] + -1;
    do {
      Imf_3_4::RgbaOutputFile::writePixels((int)local_238);
      iVar7 = iVar7 + 1;
    } while (iVar7 < piVar9[3]);
  }
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_238);
  Imf_3_4::Header::~Header((Header *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ecfa0);
  }
  else {
    sVar11 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_440,(char *)__s,iVar7);
  Imf_3_4::RgbaInputFile::header();
  cVar6 = Imf_3_4::Header::hasPreviewImage();
  if (cVar6 == '\0') {
    __assert_fail("file2.header ().hasPreviewImage ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                  ,99,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  Imf_3_4::RgbaInputFile::header();
  lVar13 = Imf_3_4::Header::previewImage();
  lVar13 = *(long *)(lVar13 + 8);
  lVar17 = 0;
  do {
    if (*(char *)(local_4e0 + lVar17 * 4) != *(char *)(lVar13 + lVar17 * 4)) {
      __assert_fail("preview1.pixels ()[i].r == preview2.pixels ()[i].r",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x69,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (*(char *)(local_4e0 + 1 + lVar17 * 4) != *(char *)(lVar13 + 1 + lVar17 * 4)) {
      __assert_fail("preview1.pixels ()[i].g == preview2.pixels ()[i].g",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x6a,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (*(char *)(local_4e0 + 2 + lVar17 * 4) != *(char *)(lVar13 + 2 + lVar17 * 4)) {
      __assert_fail("preview1.pixels ()[i].b == preview2.pixels ()[i].b",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x6b,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (*(char *)(local_4e0 + 3 + lVar17 * 4) != *(char *)(lVar13 + 3 + lVar17 * 4)) {
      __assert_fail("preview1.pixels ()[i].a == preview2.pixels ()[i].a",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x6c,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x2000);
  piVar14 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  local_490 = plVar5;
  iVar7 = *piVar9;
  local_488 = lVar20;
  if ((((iVar7 != *piVar14) || (iVar19 = piVar9[1], iVar19 != piVar14[1])) ||
      (piVar9[2] != piVar14[2])) || (piVar9[3] != piVar14[3])) {
    __assert_fail("dw == file2.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                  ,0x6f,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  iVar8 = (piVar9[2] - iVar7) + 1;
  uVar21 = ((piVar9[3] - iVar19) + 1) * iVar8;
  uVar18 = 0xffffffffffffffff;
  if (-1 < (int)uVar21) {
    uVar18 = (long)(int)uVar21 * 8;
  }
  pvVar15 = operator_new__(uVar18);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            (local_440,(long)pvVar15 + (long)(iVar19 * iVar8) * -8 + (long)iVar7 * -8,1);
  Imf_3_4::RgbaInputFile::readPixels((int)local_440,piVar9[1]);
  if (0 < (int)uVar21) {
    uVar18 = 0;
    do {
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar10 + uVar18 * 8) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar15 + uVar18 * 8) * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("pixels1[i].r == pixels2[i].r",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                      ,0x7c,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar10 + uVar18 * 8 + 2) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar15 + uVar18 * 8 + 2) * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("pixels1[i].g == pixels2[i].g",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                      ,0x7d,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar10 + uVar18 * 8 + 4) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar15 + uVar18 * 8 + 4) * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("pixels1[i].b == pixels2[i].b",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                      ,0x7e,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar10 + uVar18 * 8 + 6) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar15 + uVar18 * 8 + 6) * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("pixels1[i].a == pixels2[i].a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                      ,0x7f,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      uVar18 = uVar18 + 1;
    } while (uVar21 != uVar18);
  }
  operator_delete__(pvVar15);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
  plVar5 = local_490;
  if (local_490 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ecfa0);
  }
  else {
    sVar11 = strlen((char *)local_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar5,sVar11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pHVar12 = (Header *)Imf_3_4::RgbaInputFile::header();
  Imf_3_4::Header::Header((Header *)local_440,pHVar12);
  Imf_3_4::PreviewImage::PreviewImage((PreviewImage *)local_238,0x80,0x40,(PreviewRgba *)0x0);
  Imf_3_4::Header::setPreviewImage((PreviewImage *)local_440);
  Imf_3_4::PreviewImage::~PreviewImage((PreviewImage *)local_238);
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_238,(char *)plVar5,(Header *)local_440,WRITE_RGBA,iVar7);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_238,local_4b8,1);
  if (piVar9[1] <= piVar9[3]) {
    iVar7 = piVar9[1];
    do {
      Imf_3_4::RgbaOutputFile::writePixels((int)local_238);
      if (iVar7 == (piVar9[3] + piVar9[1]) / 2) {
        Imf_3_4::RgbaOutputFile::updatePreviewImage((PreviewRgba *)local_238);
      }
      bVar4 = iVar7 < piVar9[3];
      iVar7 = iVar7 + 1;
    } while (bVar4);
  }
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_238);
  Imf_3_4::Header::~Header((Header *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing files ",0x10);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ecfa0);
  }
  else {
    sVar11 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
  if (plVar5 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ecfa0);
  }
  else {
    sVar11 = strlen((char *)plVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar5,sVar11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::ifstream::ifstream(local_440);
  std::ifstream::ifstream(local_238);
  std::filebuf::open(local_430,(_Ios_Openmode)__s);
  std::filebuf::open(local_228,(_Ios_Openmode)plVar5);
  while( true ) {
    iVar7 = std::istream::get();
    iVar19 = std::istream::get();
    uVar21 = *(uint *)((long)auStack_420 + *(long *)((long)local_440[0] + -0x18));
    if ((uVar21 & 2) != 0) {
      std::ifstream::~ifstream(local_238);
      std::ifstream::~ifstream(local_440);
      remove((char *)__s);
      remove((char *)plVar5);
      Imf_3_4::PreviewImage::~PreviewImage((PreviewImage *)local_4e8);
      operator_delete__(pvVar10);
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_480);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      if (local_4d8[0] != local_4c8) {
        operator_delete(local_4d8[0],local_4c8[0] + 1);
      }
      if (local_4b0[0] != local_4a0) {
        operator_delete(local_4b0[0],local_4a0[0] + 1);
      }
      return;
    }
    if (iVar7 != iVar19) break;
    if (((uVar21 & 5) != 0) || ((abStack_218[*(long *)((long)local_238[0] + -0x18)] & 5) != 0)) {
      __assert_fail("!!file2 && !!file3",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0xa6,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
  }
  __assert_fail("c2 == c3",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                ,0xa5,
                "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
               );
}

Assistant:

void
testPreviewImage (const std::string& tempDir)
{
    std::string filename1 = tempDir + "imf_preview1.exr";
    std::string filename2 = tempDir + "imf_preview2.exr";

    try
    {
        cout << "Testing preview image attribute" << endl;

        readWriteFiles (
            ILM_IMF_TEST_IMAGEDIR "comp_piz.exr",
            filename1.c_str (),
            filename2.c_str ());

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}